

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * add_slash(char *path)

{
  char *pcVar1;
  
  if (*path == '\0') {
    path = (char *)0x0;
  }
  else {
    pcVar1 = point_basename(path);
    if (*pcVar1 != '\0') {
      pcVar1 = strcat(path,G_SLASH_CHAR);
      return pcVar1;
    }
  }
  return path;
}

Assistant:

char *add_slash(char *path)
{
	size_t len = strlen(path);
	if (len == 0)
	{
		return NULL;
	}
	char *p = point_basename((const char *)path);
	if (*p != '\0')
	{
		strcat(path, G_SLASH_CHAR);
	}
	return path;
}